

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlFlowGraph.cpp
# Opt level: O0

void __thiscall ControlFlowGraph::buildFunction(ControlFlowGraph *this,Function *function)

{
  bool bVar1;
  GraphBuilder *this_00;
  LockNode *unaff_retaddr;
  CriticalSectionsBuilder *in_stack_00000008;
  LockNode *lock;
  iterator __end1;
  iterator __begin1;
  set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_> *__range1;
  set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_> locks;
  NodeSequence nodeSeq;
  Function *in_stack_000000a8;
  GraphBuilder *in_stack_000000b0;
  set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_> *in_stack_ffffffffffffff78;
  _Rb_tree_const_iterator<LockNode_*> *in_stack_ffffffffffffff80;
  _Self local_68;
  _Self local_60;
  Node *node;
  ThreadRegionsBuilder *in_stack_ffffffffffffffb0;
  GraphBuilder *in_stack_ffffffffffffffc8;
  
  std::unique_ptr<GraphBuilder,_std::default_delete<GraphBuilder>_>::operator->
            ((unique_ptr<GraphBuilder,_std::default_delete<GraphBuilder>_> *)0x1b31c6);
  GraphBuilder::buildFunction(in_stack_000000b0,in_stack_000000a8);
  std::unique_ptr<GraphBuilder,_std::default_delete<GraphBuilder>_>::operator->
            ((unique_ptr<GraphBuilder,_std::default_delete<GraphBuilder>_> *)0x1b31e7);
  GraphBuilder::matchForksAndJoins
            ((GraphBuilder *)locks._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  std::unique_ptr<GraphBuilder,_std::default_delete<GraphBuilder>_>::operator->
            ((unique_ptr<GraphBuilder,_std::default_delete<GraphBuilder>_> *)0x1b31f9);
  GraphBuilder::matchLocksAndUnlocks(in_stack_000000b0);
  std::unique_ptr<GraphBuilder,_std::default_delete<GraphBuilder>_>::operator->
            ((unique_ptr<GraphBuilder,_std::default_delete<GraphBuilder>_> *)0x1b320b);
  GraphBuilder::getLocks(in_stack_ffffffffffffffc8);
  node = (Node *)&stack0xffffffffffffffb0;
  local_60._M_node =
       (_Base_ptr)
       std::set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_>::begin
                 (in_stack_ffffffffffffff78);
  local_68._M_node =
       (_Base_ptr)
       std::set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_>::end
                 (in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = std::operator!=(&local_60,&local_68);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<LockNode_*>::operator*
              ((_Rb_tree_const_iterator<LockNode_*> *)0x1b325f);
    std::unique_ptr<CriticalSectionsBuilder,_std::default_delete<CriticalSectionsBuilder>_>::
    operator->((unique_ptr<CriticalSectionsBuilder,_std::default_delete<CriticalSectionsBuilder>_> *
               )0x1b3275);
    CriticalSectionsBuilder::buildCriticalSection(in_stack_00000008,unaff_retaddr);
    std::_Rb_tree_const_iterator<LockNode_*>::operator++(in_stack_ffffffffffffff80);
  }
  this_00 = (GraphBuilder *)
            std::unique_ptr<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_>::
            operator->((unique_ptr<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_>
                        *)0x1b329c);
  std::unique_ptr<GraphBuilder,_std::default_delete<GraphBuilder>_>::operator->
            ((unique_ptr<GraphBuilder,_std::default_delete<GraphBuilder>_> *)0x1b32ab);
  GraphBuilder::size(this_00);
  ThreadRegionsBuilder::reserve((ThreadRegionsBuilder *)this_00,(size_t)in_stack_ffffffffffffff78);
  std::unique_ptr<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_>::operator->
            ((unique_ptr<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_> *)
             0x1b32ce);
  ThreadRegionsBuilder::build(in_stack_ffffffffffffffb0,node);
  std::set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_>::~set
            ((set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_> *)0x1b32e5);
  return;
}

Assistant:

void ControlFlowGraph::buildFunction(const llvm::Function *function) {
    auto nodeSeq = graphBuilder->buildFunction(function);
    graphBuilder->matchForksAndJoins();
    graphBuilder->matchLocksAndUnlocks();

    auto locks = graphBuilder->getLocks();

    for (auto *lock : locks) {
        criticalSectionsBuilder->buildCriticalSection(lock);
    }

    threadRegionsBuilder->reserve(graphBuilder->size());
    threadRegionsBuilder->build(nodeSeq.first);
}